

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O1

void __thiscall
SplitOnceTest_random_view_Test<char32_t>::TestBody(SplitOnceTest_random_view_Test<char32_t> *this)

{
  long lVar1;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  pair<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>_>
  split_result;
  RandomTestData<char32_t,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  data;
  AssertHelper local_d0 [8];
  Message local_c8;
  undefined7 uStack_c7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  local_a8;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_98;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_88;
  RandomTestData<char32_t,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  local_70;
  
  RandomTestData<char32_t,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  ::RandomTestData(&local_70,L'\0',0,0);
  if ((long)local_70.m_str._M_string_length < 1) {
    local_88._M_len = 0;
    local_88._M_str = (char32_t *)0x0;
    local_98._M_len = 0;
    local_98._M_str = (pointer)0x0;
  }
  else {
    lVar1 = 0;
    do {
      if (*(int *)((long)local_70.m_str._M_dataplus._M_p + lVar1) == 0) {
        local_98._M_len = lVar1 >> 2;
        local_88._M_str = (char32_t *)((long)local_70.m_str._M_dataplus._M_p + lVar1 + 4);
        local_88._M_len = (long)((local_70.m_str._M_string_length * 4 - lVar1) + -4) >> 2;
        local_98._M_str = local_70.m_str._M_dataplus._M_p;
        goto LAB_0033ab22;
      }
      lVar1 = lVar1 + 4;
    } while (local_70.m_str._M_string_length * 4 - lVar1 != 0);
    local_98._M_len = local_70.m_str._M_string_length;
    local_98._M_str = local_70.m_str._M_dataplus._M_p;
    local_88._M_len = 0;
    local_88._M_str = (char32_t *)0x0;
  }
LAB_0033ab22:
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char32_t,std::char_traits<char32_t>>,std::__cxx11::u32string>
            ((internal *)local_b8,"split_result.first","data.m_tokens[0]",&local_98,
             local_70.m_tokens.
             super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message(&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x91,pcVar2);
    testing::internal::AssertHelper::operator=(local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    if ((long *)CONCAT71(uStack_c7,local_c8) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_c7,local_c8) + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  RandomTestData<char32_t,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  ::get_remainder((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                  local_b8,&local_70,1);
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char32_t,std::char_traits<char32_t>>,std::__cxx11::u32string>
            ((internal *)&local_c8,"split_result.second","data.get_remainder(1)",&local_88,
             (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)CONCAT71(local_b8._1_7_,local_b8[0]) != &local_a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
                     *)CONCAT71(local_b8._1_7_,local_b8[0]),local_a8._M_allocated_capacity * 4 + 4);
  }
  if (local_c8 == (Message)0x0) {
    testing::Message::Message((Message *)local_b8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x92,pcVar2);
    testing::internal::AssertHelper::operator=(local_d0,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    if ((long *)CONCAT71(local_b8._1_7_,local_b8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_b8._1_7_,local_b8[0]) + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  std::
  vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::~vector(&local_70.m_tokens);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70.m_str._M_dataplus._M_p != &local_70.m_str.field_2) {
    operator_delete(local_70.m_str._M_dataplus._M_p,
                    local_70.m_str.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70.m_delim._M_dataplus._M_p != &local_70.m_delim.field_2) {
    operator_delete(local_70.m_delim._M_dataplus._M_p,
                    local_70.m_delim.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

TYPED_TEST(SplitOnceTest, random_view) {
	RandomTestData<TypeParam> data{};
	std::pair<std::basic_string_view<TypeParam>, std::basic_string_view<TypeParam>> split_result = split_once_view(data.m_str, default_delim<TypeParam>);

	EXPECT_EQ(split_result.first, data.m_tokens[0]);
	EXPECT_EQ(split_result.second, data.get_remainder(1));
}